

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O3

CK_OBJECT_HANDLE __thiscall
HandleManager::addTokenObject
          (HandleManager *this,CK_SLOT_ID slotID,bool isPrivate,CK_VOID_PTR object)

{
  mapped_type mVar1;
  iterator __position;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  CK_ULONG *__k;
  _Rb_tree_header *p_Var8;
  MutexLocker lock;
  Handle h;
  CK_VOID_PTR local_68;
  MutexLocker local_60;
  Handle local_50;
  
  local_68 = object;
  MutexLocker::MutexLocker(&local_60,this->handlesMutex);
  p_Var5 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var8 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
    __position._M_node = &p_Var8->_M_header;
    do {
      if (*(CK_VOID_PTR *)(p_Var5 + 1) >= object) {
        __position._M_node = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(CK_VOID_PTR *)(p_Var5 + 1) < object];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)__position._M_node != p_Var8) &&
       (*(CK_VOID_PTR *)(__position._M_node + 1) <= object)) {
      p_Var6 = (this->handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var6 != (_Base_ptr)0x0) {
        p_Var8 = &(this->handles)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = __position._M_node[1]._M_parent;
        p_Var4 = &p_Var8->_M_header;
        do {
          if (*(_Base_ptr *)(p_Var6 + 1) >= p_Var7) {
            p_Var4 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[*(_Base_ptr *)(p_Var6 + 1) < p_Var7];
        } while (p_Var6 != (_Base_ptr)0x0);
        if (((((_Rb_tree_header *)p_Var4 != p_Var8) && (*(_Base_ptr *)(p_Var4 + 1) <= p_Var7)) &&
            (p_Var4[1]._M_parent == (_Base_ptr)0x2)) && (p_Var4[1]._M_left == (_Base_ptr)slotID))
        goto LAB_001630f3;
      }
      std::
      _Rb_tree<void*,std::pair<void*const,unsigned_long>,std::_Select1st<std::pair<void*const,unsigned_long>>,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>
      ::erase_abi_cxx11_((_Rb_tree<void*,std::pair<void*const,unsigned_long>,std::_Select1st<std::pair<void*const,unsigned_long>>,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>
                          *)&this->objects,__position);
      p_Var7 = (_Base_ptr)0x0;
      goto LAB_001630f3;
    }
  }
  Handle::Handle(&local_50,2,slotID);
  this->handleCounter = this->handleCounter + 1;
  __k = &this->handleCounter;
  local_50.object = object;
  local_50.isPrivate = isPrivate;
  pmVar2 = std::
           map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
           ::operator[](&this->handles,__k);
  pmVar2->isPrivate = local_50.isPrivate;
  pmVar2->hSession = local_50.hSession;
  pmVar2->object = local_50.object;
  pmVar2->kind = local_50.kind;
  pmVar2->slotID = local_50.slotID;
  mVar1 = *__k;
  pmVar3 = std::
           map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
           ::operator[](&this->objects,&local_68);
  *pmVar3 = mVar1;
  p_Var7 = (_Base_ptr)*__k;
LAB_001630f3:
  MutexLocker::~MutexLocker(&local_60);
  return (CK_OBJECT_HANDLE)p_Var7;
}

Assistant:

CK_OBJECT_HANDLE HandleManager::addTokenObject(CK_SLOT_ID slotID, bool isPrivate, CK_VOID_PTR object)
{
	MutexLocker lock(handlesMutex);

	// Return existing handle when the object has already been registered.
	std::map< CK_VOID_PTR, CK_ULONG>::iterator oit = objects.find(object);
	if (oit != objects.end()) {
		std::map< CK_ULONG, Handle>::iterator hit = handles.find(oit->second);
		if (hit == handles.end() || CKH_OBJECT != hit->second.kind || slotID != hit->second.slotID) {
			objects.erase(oit);
			return CK_INVALID_HANDLE;
		} else
			return oit->second;
	}

	// Token objects are not associated with a specific session.
	Handle h( CKH_OBJECT, slotID );
	h.isPrivate = isPrivate;
	h.object = object;
	handles[++handleCounter] = h;
	objects[object] = handleCounter;
	return (CK_OBJECT_HANDLE)handleCounter;
}